

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<unsigned_int>::loadFromIterator<Kernel::FormulaVarIterator>
          (Stack<unsigned_int> *this,FormulaVarIterator *it)

{
  bool bVar1;
  FormulaVarIterator *in_RSI;
  FormulaVarIterator *in_stack_000001c8;
  uint in_stack_ffffffffffffffdc;
  
  while( true ) {
    bVar1 = Kernel::FormulaVarIterator::hasNext(in_stack_000001c8);
    if (!bVar1) break;
    Kernel::FormulaVarIterator::next(in_RSI);
    push((Stack<unsigned_int> *)in_RSI,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }